

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void luaC_upvalbarrier_(lua_State *L,GCObject *o)

{
  byte bVar1;
  
  if (L->l_G->gcstate < 3) {
    bVar1 = o->marked;
    if ((bVar1 & 0x18) != 0) {
      if (9 < (o->tt & 0xe)) {
        __assert_fail("(((o)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x12d,"void luaC_upvalbarrier_(lua_State *, GCObject *)");
      }
      reallymarkobject(L->l_G,o);
      bVar1 = o->marked;
    }
    if ((bVar1 & 6) == 0) {
      o->marked = bVar1 & 0xf8 | 2;
    }
  }
  return;
}

Assistant:

void luaC_upvalbarrier_(lua_State* L, GCObject* o) {
  global_State* g = G(L);
  if (keepinvariant(g)) {
    markobject(g, o);
    if (!isold(o)) {
      setage(o, G_OLD0);
    }
  }
}